

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalxor(NeuralNetworkLayer *this)

{
  LogicalXorLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x34d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x34d;
    this_00 = (LogicalXorLayerParams *)operator_new(0x18);
    LogicalXorLayerParams::LogicalXorLayerParams(this_00);
    (this->layer_).logicalxor_ = this_00;
  }
  return (LogicalXorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::mutable_logicalxor() {
  if (!has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = new ::CoreML::Specification::LogicalXorLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalXor)
  return layer_.logicalxor_;
}